

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall
TCLAP::Arg::Arg(Arg *this,string *flag,string *name,string *desc,bool req,bool valreq,Visitor *v)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  SpecificationException *pSVar4;
  long lVar5;
  bool local_419;
  bool local_409;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  byte local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  byte local_28a;
  byte local_289;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e1;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  byte local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  byte local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_3d [19];
  byte local_2a;
  byte local_29;
  bool valreq_local;
  string *psStack_28;
  bool req_local;
  string *desc_local;
  string *name_local;
  string *flag_local;
  Arg *this_local;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_0018f320;
  local_2a = valreq;
  local_29 = req;
  psStack_28 = desc;
  desc_local = name;
  name_local = flag;
  flag_local = (string *)this;
  std::__cxx11::string::string((string *)&this->_flag,(string *)flag);
  std::__cxx11::string::string((string *)&this->_name,(string *)desc_local);
  std::__cxx11::string::string((string *)&this->_description,(string *)psStack_28);
  this->_required = (bool)(local_29 & 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_requireLabel,"required",local_3d);
  std::allocator<char>::~allocator((allocator<char> *)local_3d);
  this->_valueRequired = (bool)(local_2a & 1);
  this->_alreadySet = false;
  this->_visitor = v;
  this->_ignoreable = true;
  this->_xorSet = false;
  this->_acceptsMultipleValues = false;
  uVar3 = std::__cxx11::string::length();
  if (1 < uVar3) {
    local_89 = 1;
    pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"Argument flag can only be one character long",&local_61);
    (*this->_vptr_Arg[7])(&local_88);
    SpecificationException::SpecificationException(pSVar4,&local_60,&local_88);
    local_89 = 0;
    __cxa_throw(pSVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  local_d1 = 0;
  local_f9 = 0;
  ignoreNameString_abi_cxx11_();
  bVar1 = std::operator!=(&this->_name,&local_b0);
  local_409 = false;
  if (bVar1) {
    flagStartString_abi_cxx11_();
    local_d1 = 1;
    _Var2 = std::operator==(&this->_flag,&local_d0);
    local_419 = true;
    if (!_Var2) {
      nameStartString_abi_cxx11_();
      local_f9 = 1;
      _Var2 = std::operator==(&this->_flag,&local_f8);
      local_419 = true;
      if (!_Var2) {
        local_419 = std::operator==(&this->_flag," ");
      }
    }
    local_409 = local_419;
  }
  if ((local_f9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  if (local_409 != false) {
    local_1e1 = 1;
    pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
    flagStartString_abi_cxx11_();
    std::operator+(&local_180,"Argument flag cannot be either \'",&local_1a0);
    std::operator+(&local_160,&local_180,"\' or \'");
    nameStartString_abi_cxx11_();
    std::operator+(&local_140,&local_160,&local_1c0);
    std::operator+(&local_120,&local_140,"\' or a space.");
    (*this->_vptr_Arg[7])(&local_1e0);
    SpecificationException::SpecificationException(pSVar4,&local_120,&local_1e0);
    local_1e1 = 0;
    __cxa_throw(pSVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  local_289 = 0;
  local_28a = 0;
  local_2b1 = 0;
  flagStartString_abi_cxx11_();
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_208,(ulong)&this->_name);
  flagStartString_abi_cxx11_();
  _Var2 = std::operator==(&local_208,&local_248);
  bVar1 = true;
  if (!_Var2) {
    nameStartString_abi_cxx11_();
    local_289 = 1;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_268,(ulong)&this->_name);
    local_28a = 1;
    nameStartString_abi_cxx11_();
    local_2b1 = 1;
    _Var2 = std::operator==(&local_268,&local_2b0);
    bVar1 = true;
    if (!_Var2) {
      lVar5 = std::__cxx11::string::find((char *)&this->_name,0x17a9b9);
      bVar1 = lVar5 != -1;
    }
  }
  if ((local_2b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if ((local_28a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_268);
  }
  if ((local_289 & 1) != 0) {
    std::__cxx11::string::~string(local_288);
  }
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_228);
  if (bVar1) {
    pSVar4 = (SpecificationException *)__cxa_allocate_exception(0x68);
    flagStartString_abi_cxx11_();
    std::operator+(&local_338,"Argument name begin with either \'",&local_358);
    std::operator+(&local_318,&local_338,"\' or \'");
    nameStartString_abi_cxx11_();
    std::operator+(&local_2f8,&local_318,&local_378);
    std::operator+(&local_2d8,&local_2f8,"\' or space.");
    (*this->_vptr_Arg[7])(&local_398);
    SpecificationException::SpecificationException(pSVar4,&local_2d8,&local_398);
    __cxa_throw(pSVar4,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  return;
}

Assistant:

inline Arg::Arg(const std::string& flag,
         const std::string& name,
         const std::string& desc,
         bool req,
         bool valreq,
         Visitor* v) :
  _flag(flag),
  _name(name),
  _description(desc),
  _required(req),
  _requireLabel("required"),
  _valueRequired(valreq),
  _alreadySet(false),
  _visitor( v ),
  _ignoreable(true),
  _xorSet(false),
  _acceptsMultipleValues(false)
{
	if ( _flag.length() > 1 )
		throw(SpecificationException(
				"Argument flag can only be one character long", toString() ) );

	if ( _name != ignoreNameString() &&
		 ( _flag == Arg::flagStartString() ||
		   _flag == Arg::nameStartString() ||
		   _flag == " " ) )
		throw(SpecificationException("Argument flag cannot be either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or a space.",
							toString() ) );

	if ( ( _name.substr( 0, Arg::flagStartString().length() ) == Arg::flagStartString() ) ||
		 ( _name.substr( 0, Arg::nameStartString().length() ) == Arg::nameStartString() ) ||
		 ( _name.find( " ", 0 ) != std::string::npos ) )
		throw(SpecificationException("Argument name begin with either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or space.",
							toString() ) );

}